

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEAProtocol.h
# Opt level: O3

int AnalyzeSentenceNMEA(char *buf,int buflen,char *talkerid,char *mnemonic,int *psentencelen,
                       int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  byte bVar1;
  uint in_EAX;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  char checksum [4];
  undefined8 uStack_38;
  
  *psentencelen = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 3) {
    *pnbBytesToRequest = 3 - buflen;
  }
  else {
    if ((0x3a < (ulong)(byte)*buf) || ((0x400001200000000U >> ((ulong)(byte)*buf & 0x3f) & 1) == 0))
    goto LAB_0011160d;
    talkerid[0] = '\0';
    talkerid[1] = '\0';
    talkerid[2] = '\0';
    mnemonic[4] = '\0';
    mnemonic[5] = '\0';
    mnemonic[0] = '\0';
    mnemonic[1] = '\0';
    mnemonic[2] = '\0';
    mnemonic[3] = '\0';
    uVar8 = 9;
    if ((uint)buflen < 9) {
      uVar8 = (ulong)(uint)buflen;
    }
    uVar4 = 1;
    do {
      if (((ulong)(byte)buf[uVar4] < 0x2d) &&
         ((0x140000002400U >> ((ulong)(byte)buf[uVar4] & 0x3f) & 1) != 0)) {
        uVar8 = uVar4 & 0xffffffff;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
    uVar5 = (uint)uVar8;
    if (uVar5 != buflen) {
      uVar9 = 2;
      if (uVar5 < 6) {
        if (uVar5 == 5) {
          uVar9 = 1;
        }
        else if (uVar5 != 3) goto LAB_0011160d;
      }
      uVar8 = 1;
      do {
        talkerid[uVar8 - 1] = buf[uVar8];
        uVar4 = uVar8 + 1;
        bVar10 = uVar8 != uVar9;
        uVar8 = uVar4;
      } while (bVar10);
      uVar7 = uVar5 + ~uVar9;
      if (uVar7 != 0 && SCARRY4(uVar5,~uVar9) == (int)uVar7 < 0) {
        uVar8 = 0;
        do {
          mnemonic[uVar8] = buf[uVar4];
          uVar4 = uVar4 + 1;
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if ((int)uVar4 < buflen) {
        pcVar6 = buf + (uVar4 & 0xffffffff);
        do {
          iVar3 = (int)uVar4;
          if ((*pcVar6 == '\n') || (*pcVar6 == '\r')) {
            uVar5 = iVar3 + 1;
            uVar8 = (ulong)uVar5;
            uVar9 = 1;
            if (((int)uVar5 < buflen) && ((buf[uVar5] == '\n' || (buf[uVar5] == '\r')))) {
              uVar9 = 2;
              uVar8 = (ulong)(iVar3 + 2);
            }
            iVar3 = (int)uVar8;
            *psentencelen = iVar3;
            if (buf[(int)(iVar3 + -uVar9 + -3)] != '*') {
              return 0;
            }
            uStack_38 = (ulong)in_EAX;
            uVar4 = 0;
            if (iVar3 < 2) goto LAB_001115b7;
            uVar4 = 1;
            bVar1 = 0;
            goto LAB_0011159f;
          }
          uVar4 = (ulong)(iVar3 + 1U);
          pcVar6 = pcVar6 + 1;
        } while ((int)(iVar3 + 1U) < buflen);
      }
    }
    *pnbBytesToRequest = 1;
  }
  return 6;
  while( true ) {
    bVar1 = bVar1 ^ buf[uVar4];
    uVar4 = uVar4 + 1;
    if (uVar8 == uVar4) break;
LAB_0011159f:
    if (buf[uVar4] == 0x2a) break;
  }
  uVar4 = (ulong)bVar1;
LAB_001115b7:
  sprintf((char *)((long)&uStack_38 + 4),"*%02X",uVar4);
  iVar3 = *psentencelen;
  iVar2 = toupper((int)buf[(int)(iVar3 + -uVar9 + -2)]);
  if (iVar2 == uStack_38._5_1_) {
    iVar3 = toupper((int)buf[(int)(iVar3 + ~uVar9)]);
    if (iVar3 == uStack_38._6_1_) {
      return 0;
    }
  }
LAB_0011160d:
  *pnbBytesToDiscard = 1;
  return 1;
}

Assistant:

inline int AnalyzeSentenceNMEA(char* buf, int buflen, char* talkerid, char* mnemonic, int* psentencelen, 
								   int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	int offset = 0, i = 0, nb_bytes_talkerid = MIN_NB_BYTES_TALKER_ID_NMEA, nb_bytes_mnemonic = MIN_NB_BYTES_MNEMONIC_NMEA, nb_bytes_end = MIN_NB_BYTES_END_NMEA;
	char checksum[MAX_NB_BYTES_CHECKSUM_NMEA+1]; // +1 for the null terminator character for strings.

	*psentencelen = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < MIN_NB_BYTES_SENTENCE_NMEA)
	{
		*pnbBytesToRequest = MIN_NB_BYTES_SENTENCE_NMEA-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if (((buf[0] != '$')&&(buf[0] != '!')&&(buf[0] != ':')))
	{
		*pnbBytesToDiscard = 1; // We are only sure that the start character can be discarded...
		return EXIT_FAILURE;
	}

	memset(talkerid, 0, MAX_NB_BYTES_TALKER_ID_NMEA+1); // +1 for the null terminator character for strings.
	memset(mnemonic, 0, MAX_NB_BYTES_MNEMONIC_NMEA+1); // +1 for the null terminator character for strings.
	// Start at i = 1 because of the start character...
	for (i = 1; i < min(buflen, 1+MAX_NB_BYTES_ADDRESS_NMEA+1); i++)
	{
		if ((buf[i] == ',')||(buf[i] == '*')||(buf[i] == '\r')||(buf[i] == '\n')) break;
	}
	if (i == buflen)
	{
		*pnbBytesToRequest = nb_bytes_end;
		return EXIT_OUT_OF_MEMORY;
	}
	else if (i >= DEFAULT_NB_BYTES_TALKER_ID_NMEA+DEFAULT_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = DEFAULT_NB_BYTES_TALKER_ID_NMEA;
	}
	else if (i == MIN_NB_BYTES_TALKER_ID_NMEA+DEFAULT_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = MIN_NB_BYTES_TALKER_ID_NMEA;
	}
	else if (i == DEFAULT_NB_BYTES_TALKER_ID_NMEA+MIN_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = DEFAULT_NB_BYTES_TALKER_ID_NMEA;
	}
	else
	{
		*pnbBytesToDiscard = 1; // We are only sure that the start character can be discarded...
		return EXIT_FAILURE;
	}

	nb_bytes_mnemonic = i-nb_bytes_talkerid-1;
	
	offset = 1;
	for (i = 0; i < nb_bytes_talkerid; i++)
	{
		talkerid[i] = buf[offset];
		offset++;
	}
	for (i = 0; i < nb_bytes_mnemonic; i++)
	{
		mnemonic[i] = buf[offset];
		offset++;
	}

	// Line endings problems...

	while (offset < buflen)
	{
		if ((buf[offset] == '\r')||(buf[offset] == '\n')) break;
		offset++;
	}
	if (offset >= buflen)
	{
		*pnbBytesToRequest = nb_bytes_end;
		return EXIT_OUT_OF_MEMORY;
	}
	offset++;
	if (offset < buflen)
	{
		if ((buf[offset] != '\n')&&(buf[offset] != '\r'))
		{
			*psentencelen = offset;
		}
		else 
		{
			*psentencelen = offset+1;
			nb_bytes_end = MAX_NB_BYTES_END_NMEA;
		}
	}
	else
	{
		*psentencelen = offset;
	}

	// If there is a checksum, check it.
	if (buf[*psentencelen-MAX_NB_BYTES_CHECKSUM_NMEA-nb_bytes_end] == '*')
	{
		ComputeChecksumNMEA(buf, *psentencelen, checksum);
		if ((toupper(buf[*psentencelen-2-nb_bytes_end]) != checksum[1])||(toupper(buf[*psentencelen-1-nb_bytes_end]) != checksum[2]))
		{ 
			PRINT_DEBUG_MESSAGE_OSUTILS(("Warning : NMEA checksum error (computed \"%.3s\", found \"*%c%c\"). \n", checksum, buf[*psentencelen-2-nb_bytes_end], buf[*psentencelen-1-nb_bytes_end]));
			//for (i = 0; i < buflen; i++) printf("%c", buf[i]);
			//printf("\n");
			//for (i = 0; i < buflen; i++) printf("0x%02x ", (unsigned)buf[i]);			
			//printf("\n");
			//*pnbBytesToDiscard = *psentencelen;
			*pnbBytesToDiscard = 1; // Not sure more than the start character can be discarded...
			return EXIT_FAILURE;	
		}
	}

	return EXIT_SUCCESS;
}